

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCreateTestSourceList.h
# Opt level: O0

cmCommand * __thiscall cmCreateTestSourceList::Clone(cmCreateTestSourceList *this)

{
  cmCommand *this_00;
  cmCreateTestSourceList *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmCreateTestSourceList((cmCreateTestSourceList *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmCreateTestSourceList; }